

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::SwapBit
          (Reflection *this,Message *message1,Message *message2,FieldDescriptor *field)

{
  bool bVar1;
  bool bVar2;
  FieldOptions *this_00;
  LogMessage *other;
  LogFinisher local_75 [7];
  bool temp_has_bit;
  byte local_61;
  LogMessage local_60;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message2_local;
  Message *message1_local;
  Reflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message2;
  message2_local = message1;
  message1_local = (Message *)this;
  this_00 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::weak(this_00);
  local_61 = 0;
  if (bVar1) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xa02);
    local_61 = 1;
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: !field->options().weak(): ");
    internal::LogFinisher::operator=(local_75,other);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  bVar1 = internal::ReflectionSchema::HasHasbits(&this->schema_);
  if (bVar1) {
    bVar1 = HasBit(this,message2_local,local_28);
    bVar2 = HasBit(this,(Message *)field_local,local_28);
    if (bVar2) {
      SetBit(this,message2_local,local_28);
    }
    else {
      ClearBit(this,message2_local,local_28);
    }
    if (bVar1) {
      SetBit(this,(Message *)field_local,local_28);
    }
    else {
      ClearBit(this,(Message *)field_local,local_28);
    }
  }
  return;
}

Assistant:

void Reflection::SwapBit(Message* message1, Message* message2,
                         const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!field->options().weak());
  if (!schema_.HasHasbits()) {
    return;
  }
  bool temp_has_bit = HasBit(*message1, field);
  if (HasBit(*message2, field)) {
    SetBit(message1, field);
  } else {
    ClearBit(message1, field);
  }
  if (temp_has_bit) {
    SetBit(message2, field);
  } else {
    ClearBit(message2, field);
  }
}